

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompr.c
# Opt level: O3

int uncompress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong *sourceLen)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uLongf uVar4;
  uLong uVar5;
  Byte buf [1];
  Bytef local_b1;
  Bytef *local_b0;
  uLong *local_a8;
  z_stream local_a0;
  
  uVar5 = *sourceLen;
  uVar4 = *destLen;
  if (uVar4 == 0) {
    uVar4 = 1;
    dest = &local_b1;
  }
  else {
    *destLen = 0;
  }
  local_a0.avail_in = 0;
  local_a0.zalloc = (alloc_func)0x0;
  local_a0.zfree = (free_func)0x0;
  local_a0.opaque = (voidpf)0x0;
  local_a0.next_in = source;
  iVar1 = inflateInit_(&local_a0,"1.2.11",0x70);
  if (iVar1 == 0) {
    local_a0.avail_out = 0;
    local_b0 = dest;
    local_a8 = sourceLen;
    local_a0.next_out = dest;
    do {
      if (local_a0.avail_out == 0) {
        uVar3 = 0xffffffff;
        if (uVar4 < 0xffffffff) {
          uVar3 = uVar4;
        }
        local_a0.avail_out = (uInt)uVar3;
        uVar4 = uVar4 - uVar3;
      }
      if (local_a0.avail_in == 0) {
        uVar3 = 0xffffffff;
        if (uVar5 < 0xffffffff) {
          uVar3 = uVar5;
        }
        local_a0.avail_in = (uInt)uVar3;
        uVar5 = uVar5 - uVar3;
      }
      iVar2 = inflate(&local_a0,0);
    } while (iVar2 == 0);
    *local_a8 = *local_a8 - (uVar5 + local_a0.avail_in);
    if (local_b0 == &local_b1) {
      uVar3 = 1;
      if (local_a0.total_out == 0) {
        uVar3 = uVar4;
      }
      if (iVar2 == -5) {
        uVar4 = uVar3;
      }
    }
    else {
      *destLen = local_a0.total_out;
    }
    inflateEnd(&local_a0);
    if (iVar2 == 2) {
      iVar1 = -3;
    }
    else if (iVar2 == 1) {
      iVar1 = 0;
    }
    else if ((iVar2 != -5) || (iVar1 = -3, uVar4 + local_a0.avail_out == 0)) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int ZEXPORT uncompress2 (dest, destLen, source, sourceLen)
    Bytef *dest;
    uLongf *destLen;
    const Bytef *source;
    uLong *sourceLen;
{
    z_stream stream;
    int err;
    const uInt max = (uInt)-1;
    uLong len, left;
    Byte buf[1];    /* for detection of incomplete stream when *destLen == 0 */

    len = *sourceLen;
    if (*destLen) {
        left = *destLen;
        *destLen = 0;
    }
    else {
        left = 1;
        dest = buf;
    }

    stream.next_in = (z_const Bytef *)source;
    stream.avail_in = 0;
    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = inflateInit(&stream);
    if (err != Z_OK) return err;

    stream.next_out = dest;
    stream.avail_out = 0;

    do {
        if (stream.avail_out == 0) {
            stream.avail_out = left > (uLong)max ? max : (uInt)left;
            left -= stream.avail_out;
        }
        if (stream.avail_in == 0) {
            stream.avail_in = len > (uLong)max ? max : (uInt)len;
            len -= stream.avail_in;
        }
        err = inflate(&stream, Z_NO_FLUSH);
    } while (err == Z_OK);

    *sourceLen -= len + stream.avail_in;
    if (dest != buf)
        *destLen = stream.total_out;
    else if (stream.total_out && err == Z_BUF_ERROR)
        left = 1;

    inflateEnd(&stream);
    return err == Z_STREAM_END ? Z_OK :
           err == Z_NEED_DICT ? Z_DATA_ERROR  :
           err == Z_BUF_ERROR && left + stream.avail_out ? Z_DATA_ERROR :
           err;
}